

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O1

int Cec_ManSeqResimulateCounter(Gia_Man_t *pAig,Cec_ParSim_t *pPars,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  void **__ptr;
  void **ppvVar3;
  Vec_Ptr_t *vInfo;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  char *format;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (pCex == (Abc_Cex_t *)0x0) {
    format = "Cec_ManSeqResimulateCounter(): Counter-example is not available.\n";
  }
  else if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    format = "Cec_ManSeqResimulateCounter(): Equivalence classes are not available.\n";
  }
  else if (pAig->nRegs == 0) {
    format = "Cec_ManSeqResimulateCounter(): Not a sequential AIG.\n";
  }
  else {
    if (pAig->vCis->nSize - pAig->nRegs == pCex->nPis) {
      if (pPars->fVerbose != 0) {
        Abc_Print(1,"Resimulating %d timeframes.\n",(ulong)(pPars->nFrames + pCex->iFrame + 1));
      }
      Gia_ManRandom(1);
      uVar7 = (pPars->nFrames + pCex->iFrame + 1) * (pAig->vCis->nSize - pAig->nRegs) + pAig->nRegs;
      __ptr = (void **)malloc((long)(int)uVar7 * 0xc);
      if (0 < (int)uVar7) {
        ppvVar3 = __ptr + (int)uVar7;
        uVar5 = 0;
        do {
          __ptr[uVar5] = ppvVar3;
          uVar5 = uVar5 + 1;
          ppvVar3 = (void **)((long)ppvVar3 + 4);
        } while (uVar7 != uVar5);
      }
      vInfo = (Vec_Ptr_t *)malloc(0x10);
      vInfo->nSize = uVar7;
      vInfo->nCap = uVar7;
      vInfo->pArray = __ptr;
      Cec_ManSeqDeriveInfoFromCex(vInfo,pAig,pCex);
      if (pPars->fVerbose != 0) {
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      iVar1 = Cec_ManSeqResimulateInfo(pAig,vInfo,(Abc_Cex_t *)0x0,pPars->fCheckMiter);
      if (pPars->fVerbose != 0) {
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      if (__ptr != (void **)0x0) {
        free(__ptr);
        vInfo->pArray = (void **)0x0;
      }
      free(vInfo);
      if (pPars->fVerbose == 0) {
        return iVar1;
      }
      Abc_Print(1,"%s =","Time");
      iVar2 = clock_gettime(3,&local_40);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      Abc_Print(1,"%9.2f sec\n",(double)(lVar6 + lVar4) / 1000000.0);
      return iVar1;
    }
    format = 
    "Cec_ManSeqResimulateCounter(): The number of PIs in the AIG and the counter-example differ.\n";
  }
  Abc_Print(1,format);
  return -1;
}

Assistant:

int Cec_ManSeqResimulateCounter( Gia_Man_t * pAig, Cec_ParSim_t * pPars, Abc_Cex_t * pCex )
{
    Vec_Ptr_t * vSimInfo;
    int RetValue;
    abctime clkTotal = Abc_Clock();
    if ( pCex == NULL )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): Counter-example is not available.\n" );
        return -1;
    }
    if ( pAig->pReprs == NULL )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): Equivalence classes are not available.\n" );
        return -1;
    }
    if ( Gia_ManRegNum(pAig) == 0 )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): Not a sequential AIG.\n" );
        return -1;
    }
//    if ( Gia_ManRegNum(pAig) != pCex->nRegs || Gia_ManPiNum(pAig) != pCex->nPis )
    if ( Gia_ManPiNum(pAig) != pCex->nPis )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): The number of PIs in the AIG and the counter-example differ.\n" );
        return -1;
    }
    if ( pPars->fVerbose )
        Abc_Print( 1, "Resimulating %d timeframes.\n", pPars->nFrames + pCex->iFrame + 1 );
    Gia_ManRandom( 1 );
    vSimInfo = Vec_PtrAllocSimInfo( Gia_ManRegNum(pAig) + 
        Gia_ManPiNum(pAig) * (pPars->nFrames + pCex->iFrame + 1), 1 );
    Cec_ManSeqDeriveInfoFromCex( vSimInfo, pAig, pCex );
    if ( pPars->fVerbose )
        Gia_ManEquivPrintClasses( pAig, 0, 0 );
    RetValue = Cec_ManSeqResimulateInfo( pAig, vSimInfo, NULL, pPars->fCheckMiter );
    if ( pPars->fVerbose )
        Gia_ManEquivPrintClasses( pAig, 0, 0 );
    Vec_PtrFree( vSimInfo );
    if ( pPars->fVerbose )
        ABC_PRT( "Time", Abc_Clock() - clkTotal );
//    if ( RetValue && pPars->fCheckMiter )
//        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): An output of the miter is asserted!\n" );
    return RetValue;
}